

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

bool operator==(CESkyCoord *lhs,CESkyCoord *rhs)

{
  CESkyCoordType CVar1;
  CESkyCoordType CVar2;
  bool bVar3;
  double dVar4;
  CEAngle angsep;
  CEAngle CStack_48;
  CEAngle local_38;
  double local_28;
  
  CVar1 = CESkyCoord::GetCoordSystem(lhs);
  CVar2 = CESkyCoord::GetCoordSystem(rhs);
  if (CVar1 == CVar2) {
    CESkyCoord::AngularSeparation((CESkyCoord *)&local_38,lhs,rhs);
    local_28 = CEAngle::operator_cast_to_double(&local_38);
    CEAngle::CEAngle(&CStack_48,&local_28);
    CEAngle::~CEAngle(&local_38);
    dVar4 = CEAngle::operator_cast_to_double(&CStack_48);
    bVar3 = dVar4 <= 1.4544e-05;
    CEAngle::~CEAngle(&CStack_48);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const CESkyCoord& lhs, const CESkyCoord& rhs)
{
    bool are_equal = true;
    
    // Check the coordinate systems are equivalent
    if (lhs.GetCoordSystem() != rhs.GetCoordSystem()) {
        are_equal = false;
    }
    // Check that the x-coordinate and the y-coordinate are the same
    else {
        // Check how far appart the coordinates are from each other
        CEAngle angsep = CESkyCoord::AngularSeparation(lhs, rhs);
        // Currently require separation < 0.03 arcsec
        double marcsec_rad = 4.848e-6;
        if (angsep > 3.0*marcsec_rad) {
            are_equal = false;
        }
    }

    return are_equal;
}